

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TrueTypeEmbeddedFontWriter.cpp
# Opt level: O0

bool __thiscall
TrueTypeEmbeddedFontWriter::AddComponentGlyphs
          (TrueTypeEmbeddedFontWriter *this,uint inGlyphID,UIntSet *ioComponents)

{
  bool bVar1;
  Trace *this_00;
  size_type sVar2;
  reference puVar3;
  _Self local_50;
  _List_node_base *local_48;
  byte local_39;
  iterator iStack_38;
  bool isComposite;
  iterator itComponentGlyphs;
  GlyphEntry *glyfTableEntry;
  UIntSet *ioComponents_local;
  uint inGlyphID_local;
  TrueTypeEmbeddedFontWriter *this_local;
  
  std::_List_iterator<unsigned_int>::_List_iterator(&stack0xffffffffffffffc8);
  local_39 = 0;
  if (inGlyphID < (this->mTrueTypeInput).mMaxp.NumGlyphs) {
    itComponentGlyphs._M_node = (_List_node_base *)(this->mTrueTypeInput).mGlyf[inGlyphID];
    if (((GlyphEntry *)itComponentGlyphs._M_node != (GlyphEntry *)0x0) &&
       (sVar2 = std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>::size
                          (&((GlyphEntry *)itComponentGlyphs._M_node)->mComponentGlyphs), sVar2 != 0
       )) {
      local_39 = 1;
      local_48 = (_List_node_base *)
                 std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>::begin
                           ((list<unsigned_int,_std::allocator<unsigned_int>_> *)
                            (itComponentGlyphs._M_node + 1));
      iStack_38 = (iterator)local_48;
      while( true ) {
        local_50._M_node =
             (_List_node_base *)
             std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>::end
                       (itComponentGlyphs._M_node + 1);
        bVar1 = std::operator!=(&stack0xffffffffffffffc8,&local_50);
        if (!bVar1) break;
        puVar3 = std::_List_iterator<unsigned_int>::operator*(&stack0xffffffffffffffc8);
        std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::insert
                  (ioComponents,puVar3);
        puVar3 = std::_List_iterator<unsigned_int>::operator*(&stack0xffffffffffffffc8);
        AddComponentGlyphs(this,*puVar3,ioComponents);
        std::_List_iterator<unsigned_int>::operator++(&stack0xffffffffffffffc8);
      }
    }
    this_local._7_1_ = (bool)(local_39 & 1);
  }
  else {
    this_00 = Trace::DefaultTrace();
    Trace::TraceToLog(this_00,
                      "TrueTypeEmbeddedFontWriter::AddComponentGlyphs, error, requested glyph index %ld is larger than the maximum glyph index for this font which is %ld. "
                      ,(ulong)inGlyphID,(ulong)((this->mTrueTypeInput).mMaxp.NumGlyphs - 1));
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool TrueTypeEmbeddedFontWriter::AddComponentGlyphs(unsigned int inGlyphID,UIntSet& ioComponents)
{
	GlyphEntry* glyfTableEntry;
	UIntList::iterator itComponentGlyphs;
	bool isComposite = false;

	if(inGlyphID >= mTrueTypeInput.mMaxp.NumGlyphs)
	{
		TRACE_LOG2("TrueTypeEmbeddedFontWriter::AddComponentGlyphs, error, requested glyph index %ld is larger than the maximum glyph index for this font which is %ld. ",inGlyphID,mTrueTypeInput.mMaxp.NumGlyphs-1);
		return false;
	}

	glyfTableEntry = mTrueTypeInput.mGlyf[inGlyphID];
	if(glyfTableEntry != NULL && glyfTableEntry->mComponentGlyphs.size() > 0)
	{
		isComposite = true;
		for(itComponentGlyphs = glyfTableEntry->mComponentGlyphs.begin(); 
				itComponentGlyphs != glyfTableEntry->mComponentGlyphs.end(); 
				++itComponentGlyphs)
		{
				ioComponents.insert(*itComponentGlyphs);
				AddComponentGlyphs(*itComponentGlyphs,ioComponents);
		}
	}
	return isComposite;
}